

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O0

void __thiscall choc::value::Type::Object::~Object(Object *this)

{
  Allocator *a;
  MemberNameAndType *pMVar1;
  string_view s;
  string_view s_00;
  MemberNameAndType *m;
  MemberNameAndType *__end2;
  MemberNameAndType *__begin2;
  AllocatedVector<choc::value::MemberNameAndType> *__range2;
  Object *this_local;
  
  s._M_str = &this->members;
  s._M_len = (size_t)(this->className)._M_str;
  anon_unknown_15::freeString
            ((anon_unknown_15 *)(this->members).allocator,(Allocator *)(this->className)._M_len,s);
  __end2 = AllocatedVector<choc::value::MemberNameAndType>::begin(s._M_str);
  pMVar1 = AllocatedVector<choc::value::MemberNameAndType>::end(s._M_str);
  for (; __end2 != pMVar1; __end2 = __end2 + 1) {
    a = (Allocator *)(__end2->name)._M_len;
    s_00._M_str = (char *)a;
    s_00._M_len = (size_t)(__end2->name)._M_str;
    anon_unknown_15::freeString((anon_unknown_15 *)(this->members).allocator,a,s_00);
  }
  AllocatedVector<choc::value::MemberNameAndType>::~AllocatedVector(&this->members);
  return;
}

Assistant:

~Object() noexcept
    {
        freeString (members.allocator, className);

        for (auto& m : members)
            freeString (members.allocator, m.name);
    }